

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int hasInternalSubsetSplit(void *ctx)

{
  code *UNRECOVERED_JUMPTABLE;
  int iVar1;
  xmlSchemaSAXPlugPtr ctxt;
  
  if (((ctx != (void *)0x0) && (*(long *)((long)ctx + 0x10) != 0)) &&
     (UNRECOVERED_JUMPTABLE = *(code **)(*(long *)((long)ctx + 0x10) + 0x10),
     UNRECOVERED_JUMPTABLE != (code *)0x0)) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(*(undefined8 *)((long)ctx + 0x20));
    return iVar1;
  }
  return 0;
}

Assistant:

static int
hasInternalSubsetSplit(void *ctx)
{
    xmlSchemaSAXPlugPtr ctxt = (xmlSchemaSAXPlugPtr) ctx;
    if ((ctxt != NULL) && (ctxt->user_sax != NULL) &&
        (ctxt->user_sax->hasInternalSubset != NULL))
	return(ctxt->user_sax->hasInternalSubset(ctxt->user_data));
    return(0);
}